

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_thread.c
# Opt level: O1

void end(AVxWorker *worker)

{
  if (worker->impl_ != (AVxWorkerImpl *)0x0) {
    change_state(worker,AVX_WORKER_STATUS_NOT_OK);
    pthread_join(worker->impl_->thread_,(void **)0x0);
    pthread_mutex_destroy((pthread_mutex_t *)worker->impl_);
    pthread_cond_destroy((pthread_cond_t *)&worker->impl_->condition_);
    aom_free(worker->impl_);
    worker->impl_ = (AVxWorkerImpl *)0x0;
  }
  return;
}

Assistant:

static void end(AVxWorker *const worker) {
#if CONFIG_MULTITHREAD
  if (worker->impl_ != NULL) {
    change_state(worker, AVX_WORKER_STATUS_NOT_OK);
    pthread_join(worker->impl_->thread_, NULL);
    pthread_mutex_destroy(&worker->impl_->mutex_);
    pthread_cond_destroy(&worker->impl_->condition_);
    aom_free(worker->impl_);
    worker->impl_ = NULL;
  }
#else
  worker->status_ = AVX_WORKER_STATUS_NOT_OK;
  assert(worker->impl_ == NULL);
#endif
  assert(worker->status_ == AVX_WORKER_STATUS_NOT_OK);
}